

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LSR_AC(CPU *this)

{
  CPU *this_local;
  
  this->cycles = 2;
  (this->field_6).ps = (this->field_6).ps & 0xfe | ((this->A & 1) != 0 && -1 < (int)(this->A & 1));
  this->A = (uint8_t)((int)(uint)this->A >> 1);
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LSR_AC()
{
    cycles = 2;
    C = (A & 0b00000001) > 0;
    A >>= 1;
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}